

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookbehind_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,undefined8 *state,long *next)

{
  lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
  lVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  
  uVar2 = *state;
  bVar3 = advance_to_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long>
                    (state,-*(long *)(this + 0x10),state[3]);
  if (bVar3) {
    lVar1 = this[8];
    cVar4 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (lVar1 == (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                  )0x1) {
      if (cVar4 != '\0') {
        return false;
      }
      *state = uVar2;
    }
    else if (cVar4 == '\0') {
      *state = uVar2;
      return false;
    }
    cVar4 = (**(code **)(*next + 0x10))(next,state);
    if (cVar4 != '\0') {
      return true;
    }
  }
  else {
    *state = uVar2;
    if (this[8] ==
        (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
         )0x1) {
      uVar5 = (**(code **)(*next + 0x10))(next,state);
      return (bool)uVar5;
    }
  }
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::true_) const
        {
            typedef typename iterator_difference<BidiIter>::type difference_type;
            BidiIter const tmp = state.cur_;
            if(!detail::advance_to(state.cur_, -static_cast<difference_type>(this->width_), state.begin_))
            {
                state.cur_ = tmp;
                return this->not_ ? next.match(state) : false;
            }

            if(this->not_)
            {
                if(this->xpr_.match(state))
                {
                    BOOST_ASSERT(state.cur_ == tmp);
                    return false;
                }
                state.cur_ = tmp;
                if(next.match(state))
                {
                    return true;
                }
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
                BOOST_ASSERT(state.cur_ == tmp);
                if(next.match(state))
                {
                    return true;
                }
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }